

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.hh
# Opt level: O2

void __thiscall kratos::PortBundleRef::~PortBundleRef(PortBundleRef *this)

{
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__002be628;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->name_mappings_)._M_t);
  PortBundleDefinition::~PortBundleDefinition(&this->definition_);
  return;
}

Assistant:

PortBundleRef(Generator *generator, PortBundleDefinition def)
        : generator(generator), definition_(std::move(def)) {}